

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  xpath_variable *pxVar7;
  xml_attribute xVar8;
  byte *pbVar9;
  xpath_node *pxVar10;
  byte bVar11;
  long lVar12;
  xpath_memory_block *pxVar13;
  byte bVar14;
  xpath_node *pxVar15;
  byte bVar16;
  xpath_ast_node *pxVar17;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar18;
  char_t *__s1;
  less_equal *in_R8;
  undefined1 uVar19;
  xpath_memory_block *pxVar20;
  xml_node_struct *pxVar21;
  xpath_variable *__s2;
  bool bVar22;
  double v;
  xpath_allocator_capture local_f8;
  undefined1 local_d4;
  undefined3 uStack_d3;
  double local_d0;
  xpath_node_set_raw local_c8;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  
  local_d4 = xpath_type_none;
  uStack_d3 = 0;
LAB_0015e4ca:
  cVar3 = this->_type;
  uVar19 = xpath_type_node_set;
  switch(cVar3) {
  case '\x01':
    bVar22 = eval_boolean(this->_left,c,stack);
    lVar12 = 0x10;
    if (bVar22) goto switchD_0015e519_caseD_2f;
    break;
  case '\x02':
    bVar22 = eval_boolean(this->_left,c,stack);
    lVar12 = 0x10;
    if (!bVar22) goto switchD_0015e519_caseD_30;
    break;
  case '\x03':
    goto switchD_0015e4e1_caseD_3;
  case '\x04':
    pxVar17 = this->_left;
    this = this->_right;
    cVar3 = pxVar17->_rettype;
    cVar1 = this->_rettype;
    if ((cVar3 != '\x01') && (cVar1 != '\x01')) {
      if (cVar3 == '\x04' || cVar1 == '\x04') goto code_r0x0015e573;
      if (cVar3 != '\x02' && cVar1 != '\x02') {
        if (cVar3 == '\x03' || cVar1 == '\x03') {
          local_f8._target = stack->result;
          local_f8._state._root = (local_f8._target)->_root;
          local_f8._state._root_size = (local_f8._target)->_root_size;
          local_f8._state._error = (local_f8._target)->_error;
          eval_string((xpath_string *)&local_c8,pxVar17,c,stack);
          eval_string((xpath_string *)&local_a8,this,c,stack);
          iVar5 = strcmp((char *)local_c8._0_8_,(char *)local_a8._0_8_);
          bVar22 = iVar5 == 0;
          goto LAB_0015e9e9;
        }
        goto switchD_0015e519_caseD_30;
      }
      local_d0 = eval_number(pxVar17,c,stack);
      dVar2 = eval_number(this,c,stack);
      uVar19 = dVar2 != local_d0;
      goto switchD_0015e519_caseD_2f;
    }
    if (cVar1 == '\x01' && cVar3 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,pxVar17,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
      if (local_c8._begin != local_c8._end) {
        pxVar10 = local_c8._end;
        pxVar13 = (xpath_memory_block *)local_a8._end;
        pxVar15 = local_c8._begin;
        do {
          pxVar20 = (xpath_memory_block *)local_a8._begin;
          if ((xpath_memory_block *)local_a8._begin != pxVar13) {
            do {
              local_80._target = stack->result;
              local_80._state._error = (local_80._target)->_error;
              local_80._state._root = (local_80._target)->_root;
              local_80._state._root_size = (local_80._target)->_root_size;
              string_value(&local_60,(anon_unknown_0 *)(pxVar15->_node)._root,
                           (xpath_node *)(pxVar15->_attribute)._attr,local_80._target);
              string_value(&local_48,(anon_unknown_0 *)pxVar20->next,(xpath_node *)pxVar20->capacity
                           ,stack->result);
              iVar5 = strcmp(local_60._buffer,local_48._buffer);
              xpath_allocator_capture::~xpath_allocator_capture(&local_80);
              if (iVar5 != 0) goto LAB_0015eea8;
              pxVar13 = (xpath_memory_block *)&pxVar20->field_2;
              pxVar10 = local_c8._end;
              pxVar20 = pxVar13;
            } while (pxVar13 != (xpath_memory_block *)local_a8._end);
          }
          pxVar15 = pxVar15 + 1;
        } while (pxVar15 != pxVar10);
      }
      goto LAB_0015f14b;
    }
    pxVar18 = pxVar17;
    if (cVar3 == '\x01') {
      pxVar18 = this;
      cVar3 = cVar1;
      this = pxVar17;
    }
    if (cVar3 == '\x02') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      local_d0 = eval_number(pxVar18,c,stack);
      eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0015f14b;
      pxVar10 = local_c8._begin;
      goto LAB_0015f0da;
    }
    if (cVar3 != '\x03') {
      if (cVar3 != '\x04') goto switchD_0015e519_caseD_30;
      bVar22 = eval_boolean(pxVar18,c,stack);
      bVar4 = eval_boolean(this,c,stack);
      local_d4 = local_d4 ^ bVar4 != bVar22;
      goto LAB_0015f15d;
    }
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_string((xpath_string *)&local_80,pxVar18,c,stack);
    eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
    if (local_c8._begin == local_c8._end) goto LAB_0015f14b;
    pxVar10 = local_c8._begin;
    goto LAB_0015f012;
  case '\x05':
    pxVar18 = this->_left;
    pxVar17 = this->_right;
    goto LAB_0015e6c7;
  case '\x06':
    pxVar17 = this->_left;
    pxVar18 = this->_right;
LAB_0015e6c7:
    uVar19 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar18,pxVar17,c,stack,(less *)in_R8);
    goto switchD_0015e519_caseD_2f;
  case '\a':
    pxVar18 = this->_left;
    pxVar17 = this->_right;
    goto LAB_0015e6b2;
  case '\b':
    pxVar17 = this->_left;
    pxVar18 = this->_right;
LAB_0015e6b2:
    uVar19 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar18,pxVar17,c,stack,in_R8);
    goto switchD_0015e519_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0015e4e1_caseD_9;
  case '\x14':
    cVar3 = this->_rettype;
    if (cVar3 != '\x04') goto LAB_0015e65a;
    if (((this->_data).variable)->_type != xpath_type_boolean) goto switchD_0015e519_caseD_30;
    uVar19 = (undefined1)(this->_data).variable[1]._type;
    goto switchD_0015e519_caseD_2f;
  default:
    lVar12 = 8;
    switch(cVar3) {
    case '\"':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      bVar14 = *(byte *)(xpath_memory_block **)local_a8._0_8_;
      if (bVar14 == 0) goto LAB_0015eea8;
      lVar12 = 0;
      goto LAB_0015e83c;
    case '#':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      pcVar6 = strstr((char *)local_c8._0_8_,(char *)local_a8._0_8_);
      bVar22 = pcVar6 == (char *)0x0;
      goto LAB_0015e9e9;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_0015e4e1_caseD_9;
    case '-':
      break;
    case '.':
      bVar22 = eval_boolean(this->_left,c,stack);
      goto LAB_0015e77c;
    case '/':
      goto switchD_0015e519_caseD_2f;
    case '0':
      goto switchD_0015e519_caseD_30;
    case '1':
      if ((c->n)._attribute._attr != (xml_attribute_struct *)0x0) goto switchD_0015e519_caseD_30;
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      uVar19 = false;
      pxVar21 = (c->n)._node._root;
      local_a8._0_8_ = (xml_node_struct *)0x0;
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_a8._0_8_ = pxVar21;
      }
      if ((xml_node_struct *)local_a8._0_8_ == (xml_node_struct *)0x0) goto LAB_0015f14e;
      goto LAB_0015e746;
    default:
      if (cVar3 == ';') {
        __s2 = (this->_right->_data).variable;
        if (this->_right->_type != '\x12') {
          if (__s2->_type == xpath_type_string) {
            pxVar7 = *(xpath_variable **)(__s2 + 1);
          }
          else {
            pxVar7 = (xpath_variable *)0x0;
          }
          __s2 = (xpath_variable *)0x16ad89;
          if (pxVar7 != (xpath_variable *)0x0) {
            __s2 = pxVar7;
          }
        }
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          local_f8._target = (xpath_allocator *)(c->n)._node._root;
        }
        else {
          local_f8._target = (xpath_allocator *)0x0;
        }
        xVar8 = xml_node::attribute((xml_node *)&local_f8,(this->_left->_data).string);
        if (xVar8._attr == (xml_attribute_struct *)0x0) goto switchD_0015e519_caseD_30;
        __s1 = (xVar8._attr)->value;
        if (__s1 == (char_t *)0x0) {
          __s1 = "";
        }
        iVar5 = strcmp(__s1,(char *)__s2);
        if (iVar5 != 0) goto switchD_0015e519_caseD_30;
        pcVar6 = "";
        if ((xVar8._attr)->name != (char *)0x0) {
          pcVar6 = (xVar8._attr)->name;
        }
        cVar3 = 'x';
        lVar12 = 0;
        goto LAB_0015eafa;
      }
switchD_0015e4e1_caseD_9:
      cVar3 = this->_rettype;
LAB_0015e65a:
      if (cVar3 == '\x01') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_node_set(&local_c8,this,c,stack,nodeset_eval_any);
        bVar22 = local_c8._begin == local_c8._end;
      }
      else {
        if (cVar3 != '\x03') {
          if (cVar3 != '\x02') goto switchD_0015e519_caseD_30;
          dVar2 = eval_number(this,c,stack);
          if ((dVar2 == 0.0) && (!NAN(dVar2))) goto switchD_0015e519_caseD_30;
          uVar19 = xpath_type_node_set;
          goto switchD_0015e519_caseD_2f;
        }
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_c8,this,c,stack);
        bVar22 = *(byte *)local_c8._0_8_ == 0;
      }
LAB_0015e9e9:
      uVar19 = !bVar22;
      goto LAB_0015f14e;
    }
  }
  this = *(xpath_ast_node **)(&this->_type + lVar12);
  goto LAB_0015e4ca;
  while( true ) {
    cVar3 = "xmlns"[lVar12 + 1];
    lVar12 = lVar12 + 1;
    if (lVar12 == 5) break;
LAB_0015eafa:
    if (pcVar6[lVar12] != cVar3) goto switchD_0015e519_caseD_2f;
  }
  uVar19 = pcVar6[5] != ':' && pcVar6[5] != '\0';
  goto switchD_0015e519_caseD_2f;
  while (pxVar21 = pxVar21->parent, local_a8._0_8_ = pxVar21, pxVar21 != (xml_node_struct *)0x0) {
LAB_0015e746:
    xVar8 = xml_node::attribute((xml_node *)&local_a8,"xml:lang");
    if (xVar8._attr != (xml_attribute_struct *)0x0) {
      pbVar9 = (byte *)0x16ad89;
      if ((byte *)(xVar8._attr)->value != (byte *)0x0) {
        pbVar9 = (byte *)(xVar8._attr)->value;
      }
      bVar14 = *(byte *)local_c8._0_8_;
      if (bVar14 != 0) goto LAB_0015eba5;
      goto LAB_0015ebe5;
    }
  }
LAB_0015f14b:
  uVar19 = false;
  goto LAB_0015f14e;
  while( true ) {
    pbVar9 = pbVar9 + 1;
    bVar14 = *(byte *)local_c8._0_8_;
    if (bVar14 == 0) break;
LAB_0015eba5:
    local_c8._0_8_ = local_c8._0_8_ + 1;
    bVar11 = bVar14 | 0x20;
    if (0x19 < (int)(char)bVar14 - 0x41U) {
      bVar11 = bVar14;
    }
    bVar14 = *pbVar9;
    bVar16 = bVar14 | 0x20;
    if (0x19 < (int)(char)bVar14 - 0x41U) {
      bVar16 = bVar14;
    }
    if (bVar11 != bVar16) goto LAB_0015f14b;
  }
LAB_0015ebe5:
  uVar19 = *pbVar9 == 0x2d || *pbVar9 == 0;
  goto LAB_0015f14e;
  while( true ) {
    bVar14 = *(byte *)((long)(xpath_memory_block **)local_a8._0_8_ + lVar12 + 1);
    lVar12 = lVar12 + 1;
    if (bVar14 == 0) break;
LAB_0015e83c:
    uVar19 = *(byte *)(local_c8._0_8_ + lVar12) == bVar14;
    if (!(bool)uVar19) break;
  }
  goto LAB_0015f14e;
  while (pxVar10 = pxVar10 + 1, pxVar10 != local_c8._end) {
LAB_0015f0da:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value((xpath_string *)&local_80,(anon_unknown_0 *)(pxVar10->_node)._root,
                 (xpath_node *)(pxVar10->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
    local_88 = convert_string_to_number((char_t *)local_80._target);
    uVar19 = local_d0 != local_88;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    if ((local_d0 != local_88) || (NAN(local_d0) || NAN(local_88))) break;
  }
  goto LAB_0015f14e;
code_r0x0015e573:
  bVar22 = eval_boolean(pxVar17,c,stack);
  local_d4 = local_d4 ^ bVar22;
  goto LAB_0015e4ca;
switchD_0015e4e1_caseD_3:
  pxVar17 = this->_left;
  pxVar18 = this->_right;
  cVar3 = pxVar17->_rettype;
  cVar1 = pxVar18->_rettype;
  if (cVar1 == '\x01' || cVar3 == '\x01') {
    if (cVar1 == '\x01' && cVar3 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,pxVar17,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,pxVar18,c,stack,nodeset_eval_all);
      if (local_c8._begin != local_c8._end) {
        pxVar10 = local_c8._end;
        pxVar13 = (xpath_memory_block *)local_a8._end;
        pxVar15 = local_c8._begin;
        do {
          pxVar20 = (xpath_memory_block *)local_a8._begin;
          if ((xpath_memory_block *)local_a8._begin != pxVar13) {
            do {
              local_80._target = stack->result;
              local_80._state._error = (local_80._target)->_error;
              local_80._state._root = (local_80._target)->_root;
              local_80._state._root_size = (local_80._target)->_root_size;
              string_value(&local_60,(anon_unknown_0 *)(pxVar15->_node)._root,
                           (xpath_node *)(pxVar15->_attribute)._attr,local_80._target);
              string_value(&local_48,(anon_unknown_0 *)pxVar20->next,(xpath_node *)pxVar20->capacity
                           ,stack->result);
              iVar5 = strcmp(local_60._buffer,local_48._buffer);
              xpath_allocator_capture::~xpath_allocator_capture(&local_80);
              if (iVar5 == 0) goto LAB_0015eea8;
              pxVar13 = (xpath_memory_block *)&pxVar20->field_2;
              pxVar10 = local_c8._end;
              pxVar20 = pxVar13;
            } while (pxVar13 != (xpath_memory_block *)local_a8._end);
          }
          pxVar15 = pxVar15 + 1;
        } while (pxVar15 != pxVar10);
      }
      goto LAB_0015f14b;
    }
    this_00 = pxVar17;
    if (cVar3 == '\x01') {
      this_00 = pxVar18;
      cVar3 = cVar1;
      pxVar18 = pxVar17;
    }
    if (cVar3 == '\x02') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      local_d0 = eval_number(this_00,c,stack);
      eval_node_set(&local_c8,pxVar18,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0015f14b;
      pxVar10 = local_c8._begin;
      do {
        local_a8._0_8_ = stack->result;
        local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
        local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
        local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
        string_value((xpath_string *)&local_80,(anon_unknown_0 *)(pxVar10->_node)._root,
                     (xpath_node *)(pxVar10->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
        local_88 = convert_string_to_number((char_t *)local_80._target);
        uVar19 = local_d0 == local_88;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
        if ((local_d0 == local_88) && (!NAN(local_d0) && !NAN(local_88))) break;
        pxVar10 = pxVar10 + 1;
      } while (pxVar10 != local_c8._end);
    }
    else {
      if (cVar3 != '\x03') {
        if (cVar3 != '\x04') goto switchD_0015e519_caseD_30;
        bVar4 = eval_boolean(this_00,c,stack);
        goto LAB_0015e60f;
      }
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_80,this_00,c,stack);
      eval_node_set(&local_c8,pxVar18,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0015f14b;
      pxVar10 = local_c8._begin;
      do {
        local_a8._0_8_ = stack->result;
        local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
        local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
        local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
        string_value(&local_60,(anon_unknown_0 *)(pxVar10->_node)._root,
                     (xpath_node *)(pxVar10->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
        iVar5 = strcmp((char *)local_80._target,local_60._buffer);
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
        uVar19 = iVar5 == 0;
        if ((bool)uVar19) break;
        pxVar10 = pxVar10 + 1;
      } while (pxVar10 != local_c8._end);
    }
    goto LAB_0015f14e;
  }
  if (cVar1 == '\x04' || cVar3 == '\x04') {
    bVar4 = eval_boolean(pxVar17,c,stack);
LAB_0015e60f:
    bVar22 = eval_boolean(pxVar18,c,stack);
    bVar22 = (bool)(bVar22 ^ bVar4);
LAB_0015e77c:
    local_d4 = local_d4 ^ bVar22 ^ xpath_type_node_set;
    goto LAB_0015f15d;
  }
  if (cVar3 == '\x02' || cVar1 == '\x02') {
    local_d0 = eval_number(pxVar17,c,stack);
    dVar2 = eval_number(pxVar18,c,stack);
    uVar19 = dVar2 == local_d0;
  }
  else {
    if (cVar3 == '\x03' || cVar1 == '\x03') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,pxVar17,c,stack);
      eval_string((xpath_string *)&local_a8,pxVar18,c,stack);
      iVar5 = strcmp((char *)local_c8._0_8_,(char *)local_a8._0_8_);
      uVar19 = iVar5 == 0;
      goto LAB_0015f14e;
    }
switchD_0015e519_caseD_30:
    uVar19 = xpath_type_none;
  }
  goto switchD_0015e519_caseD_2f;
LAB_0015eea8:
  uVar19 = true;
  goto LAB_0015f14e;
  while (pxVar10 = pxVar10 + 1, pxVar10 != local_c8._end) {
LAB_0015f012:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value(&local_60,(anon_unknown_0 *)(pxVar10->_node)._root,
                 (xpath_node *)(pxVar10->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
    iVar5 = strcmp((char *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    uVar19 = iVar5 != 0;
    if ((bool)uVar19) break;
  }
LAB_0015f14e:
  xpath_allocator_capture::~xpath_allocator_capture(&local_f8);
switchD_0015e519_caseD_2f:
  local_d4 = local_d4 ^ uVar19;
LAB_0015f15d:
  return (bool)(local_d4 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != NULL;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}